

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form3_Shift(ShiftForm3 Shift)

{
  double dVar1;
  uint8_t value;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined8 in_XMM2_Qb;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  double local_98;
  uint32_t local_90;
  uint32_t local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  double local_78;
  ImageTemplate<unsigned_char> local_70;
  Image local_48;
  
  auVar7 = in_ZMM1._0_16_;
  auVar6 = in_ZMM0._0_16_;
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,value,0,0,&local_70);
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  Unit_Test::generateRoi(&local_48,&local_84,&local_88,&local_8c,&local_90);
  uVar5 = local_48._width - (local_8c + local_84);
  if (local_84 < uVar5) {
    uVar5 = local_84;
  }
  auVar6 = vcvtusi2sd_avx512f(auVar6,uVar5);
  uVar5 = local_48._height - (local_90 + local_88);
  if (local_88 < uVar5) {
    uVar5 = local_88;
  }
  auVar7 = vcvtusi2sd_avx512f(auVar7,uVar5);
  local_80 = auVar7._0_8_;
  local_98 = auVar6._0_8_ * -0.25;
  dVar1 = auVar6._0_8_ * 0.25;
  if (local_98 <= dVar1) {
    iVar3 = (int)(dVar1 - local_98);
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    iVar3 = rand();
    local_98 = local_98 + (double)(iVar3 % iVar4);
  }
  iVar4 = rand();
  auVar6._0_8_ = (double)(iVar4 % 100);
  auVar6._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar6,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  local_78 = auVar6._0_8_ + local_98;
  local_98 = local_80 * -0.25;
  if (local_98 <= local_80 * 0.25) {
    iVar3 = (int)(local_80 * 0.25 - local_98);
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    iVar3 = rand();
    local_98 = local_98 + (double)(iVar3 % iVar4);
  }
  iVar4 = rand();
  auVar7._0_8_ = (double)(iVar4 % 100);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd231sd_fma(ZEXT816(0) << 0x40,auVar7,ZEXT816(0x3f847ae147ae147b));
  (*Shift)(&local_70,&local_48,local_84,local_88,local_8c,local_90,local_78,auVar6._0_8_ + local_98)
  ;
  bVar2 = Unit_Test::equalSize(&local_70,local_8c,local_90);
  if (bVar2) {
    bVar2 = Unit_Test::verifyImage(&local_70,value);
  }
  else {
    bVar2 = false;
  }
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar2;
}

Assistant:

bool form3_Shift(ShiftForm3 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const double maxShiftX = roiX < (input.width()  - roiWidth  - roiX) ? roiX : (input.width()  - roiWidth  - roiX);
        const double maxShiftY = roiY < (input.height() - roiHeight - roiY) ? roiY : (input.height() - roiHeight - roiY);
        const double shiftX = randomFloatValue<double>( -maxShiftX / 4, maxShiftX / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -maxShiftY / 4, maxShiftY / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, roiX, roiY, roiWidth, roiHeight, shiftX, shiftY );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity );
    }